

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGen.c
# Opt level: O1

void Gia_ManCompareValues(Gia_Man_t *p,Vec_Wrd_t *vSimsIn,Vec_Int_t *vValues,char *pDumpFile)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint Correct;
  
  iVar2 = vSimsIn->nSize / p->vCis->nSize;
  if (vValues->nSize != iVar2 * 0x40) {
    __assert_fail("Vec_IntSize(vValues) == nWords * 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGen.c"
                  ,0x1a1,"void Gia_ManCompareValues(Gia_Man_t *, Vec_Wrd_t *, Vec_Int_t *, char *)")
    ;
  }
  Gia_ManSimulateWordsInit(p,vSimsIn);
  if (p->nSimWords != iVar2) {
    __assert_fail("p->nSimWords == nWords",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGen.c"
                  ,0x1a3,"void Gia_ManCompareValues(Gia_Man_t *, Vec_Wrd_t *, Vec_Int_t *, char *)")
    ;
  }
  if (p->vCos->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar1 = *p->vCos->pArray;
  if ((-1 < iVar1) && (iVar1 < p->nObjs)) {
    uVar4 = iVar1 * p->nSimWords;
    if (((int)uVar4 < 0) || (p->vSims->nSize <= (int)uVar4)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
    }
    iVar1 = vValues->nSize;
    uVar5 = (ulong)iVar1;
    iVar3 = 0;
    Correct = 0;
    if (0 < (long)uVar5) {
      uVar6 = 0;
      Correct = 0;
      do {
        Correct = Correct + ((uint)((p->vSims->pArray[(ulong)uVar4 + (uVar6 >> 6 & 0x3ffffff)] >>
                                     (uVar6 & 0x3f) & 1) != 0) == vValues->pArray[uVar6]);
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
    if (0 < iVar1) {
      uVar6 = 0;
      iVar3 = 0;
      do {
        iVar3 = iVar3 + vValues->pArray[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
    if (iVar3 == iVar2 * 0x20 || SBORROW4(iVar3,iVar2 * 0x20) != iVar3 + iVar2 * -0x20 < 0) {
      if (iVar1 < 1) {
        iVar3 = 0;
      }
      else {
        uVar6 = 0;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + vValues->pArray[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      uVar4 = iVar2 * 0x40 - iVar3;
    }
    else if (iVar1 < 1) {
      uVar4 = 0;
    }
    else {
      uVar6 = 0;
      uVar4 = 0;
      do {
        uVar4 = uVar4 + vValues->pArray[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
    printf("Total = %6d.  Errors = %6d.  Correct = %6d.  (%6.2f %%)   Naive guess = %6d.  (%6.2f %%)\n"
           ,((double)(int)Correct * 100.0) / (double)iVar1,
           ((double)(int)uVar4 * 100.0) / (double)iVar1,uVar5,(ulong)(iVar1 - Correct),
           (ulong)Correct,(ulong)uVar4);
    if (pDumpFile == (char *)0x0) {
      return;
    }
    Gia_ManSimLogStats(p,pDumpFile,vValues->nSize,Correct,uVar4);
    printf("Finished dumping statistics into file \"%s\".\n",pDumpFile);
    return;
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

void Gia_ManCompareValues( Gia_Man_t * p, Vec_Wrd_t * vSimsIn, Vec_Int_t * vValues, char * pDumpFile )
{
    int i, Value, Guess, Count = 0, nWords = Vec_WrdSize(vSimsIn) / Gia_ManCiNum(p);
    word * pSims;
    assert( Vec_IntSize(vValues) == nWords * 64 );
    Gia_ManSimulateWordsInit( p, vSimsIn );
    assert( p->nSimWords == nWords );
    pSims = Gia_ManObjSim( p, Gia_ObjId(p, Gia_ManCo(p, 0)) );
    Vec_IntForEachEntry( vValues, Value, i )
        if ( Abc_TtGetBit(pSims, i) == Value )
            Count++;
    Guess = (Vec_IntSum(vValues) > nWords * 32) ? Vec_IntSum(vValues) : nWords * 64 - Vec_IntSum(vValues);
    printf( "Total = %6d.  Errors = %6d.  Correct = %6d.  (%6.2f %%)   Naive guess = %6d.  (%6.2f %%)\n", 
        Vec_IntSize(vValues), Vec_IntSize(vValues) - Count, 
        Count, 100.0*Count/Vec_IntSize(vValues),
        Guess, 100.0*Guess/Vec_IntSize(vValues));
    if ( pDumpFile == NULL )
        return;
    Gia_ManSimLogStats( p, pDumpFile, Vec_IntSize(vValues), Count, Guess );
    printf( "Finished dumping statistics into file \"%s\".\n", pDumpFile );
}